

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O3

VariableNT __thiscall
adios2::IO::DefineVariable
          (IO *this,DataType type,string *name,Dims *shape,Dims *start,Dims *count,bool constantDims
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  IO *pointer;
  undefined1 *puVar2;
  int iVar3;
  long *plVar4;
  Variable *variable;
  size_type *psVar5;
  bool bVar6;
  VariableNT local_b0;
  Dims *local_a8;
  vector *local_a0;
  vector *local_98;
  undefined1 *local_90;
  size_t local_88;
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  pointer = this->m_IO;
  local_a0 = (vector *)shape;
  local_98 = (vector *)start;
  std::operator+(&local_70,"for variable name ",name);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_50.field_2._M_allocated_capacity = *psVar5;
    local_50.field_2._8_8_ = plVar4[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar5;
    local_50._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_50._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  helper::CheckForNullptr<adios2::core::IO>(pointer,&local_50);
  local_a8 = count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  paVar1 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  adios2::ToString_abi_cxx11_((DataType)&local_70);
  GetType<std::__cxx11::string>();
  puVar2 = local_90;
  if (local_70._M_string_length == local_88) {
    if (local_70._M_string_length == 0) {
      bVar6 = true;
    }
    else {
      iVar3 = bcmp(local_70._M_dataplus._M_p,local_90,local_70._M_string_length);
      bVar6 = iVar3 == 0;
    }
  }
  else {
    bVar6 = false;
  }
  if (puVar2 != local_80) {
    operator_delete(puVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (bVar6) {
    variable = adios2::core::IO::DefineVariable<std::__cxx11::string>
                         ((string *)this->m_IO,(vector *)name,local_a0,local_98,SUB81(local_a8,0));
  }
  else {
    adios2::ToString_abi_cxx11_((DataType)&local_70);
    GetType<char>();
    puVar2 = local_90;
    if (local_70._M_string_length == local_88) {
      if (local_70._M_string_length == 0) {
        bVar6 = true;
      }
      else {
        iVar3 = bcmp(local_70._M_dataplus._M_p,local_90,local_70._M_string_length);
        bVar6 = iVar3 == 0;
      }
    }
    else {
      bVar6 = false;
    }
    if (puVar2 != local_80) {
      operator_delete(puVar2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (bVar6) {
      variable = adios2::core::IO::DefineVariable<char>
                           ((string *)this->m_IO,(vector *)name,local_a0,local_98,SUB81(local_a8,0))
      ;
    }
    else {
      adios2::ToString_abi_cxx11_((DataType)&local_70);
      GetType<signed_char>();
      puVar2 = local_90;
      if (local_70._M_string_length == local_88) {
        if (local_70._M_string_length == 0) {
          bVar6 = true;
        }
        else {
          iVar3 = bcmp(local_70._M_dataplus._M_p,local_90,local_70._M_string_length);
          bVar6 = iVar3 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if (puVar2 != local_80) {
        operator_delete(puVar2);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (bVar6) {
        variable = adios2::core::IO::DefineVariable<signed_char>
                             ((string *)this->m_IO,(vector *)name,local_a0,local_98,
                              SUB81(local_a8,0));
      }
      else {
        adios2::ToString_abi_cxx11_((DataType)&local_70);
        GetType<short>();
        puVar2 = local_90;
        if (local_70._M_string_length == local_88) {
          if (local_70._M_string_length == 0) {
            bVar6 = true;
          }
          else {
            iVar3 = bcmp(local_70._M_dataplus._M_p,local_90,local_70._M_string_length);
            bVar6 = iVar3 == 0;
          }
        }
        else {
          bVar6 = false;
        }
        if (puVar2 != local_80) {
          operator_delete(puVar2);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if (bVar6) {
          variable = adios2::core::IO::DefineVariable<short>
                               ((string *)this->m_IO,(vector *)name,local_a0,local_98,
                                SUB81(local_a8,0));
        }
        else {
          adios2::ToString_abi_cxx11_((DataType)&local_70);
          GetType<int>();
          puVar2 = local_90;
          if (local_70._M_string_length == local_88) {
            if (local_70._M_string_length == 0) {
              bVar6 = true;
            }
            else {
              iVar3 = bcmp(local_70._M_dataplus._M_p,local_90,local_70._M_string_length);
              bVar6 = iVar3 == 0;
            }
          }
          else {
            bVar6 = false;
          }
          if (puVar2 != local_80) {
            operator_delete(puVar2);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != paVar1) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          if (bVar6) {
            variable = adios2::core::IO::DefineVariable<int>
                                 ((string *)this->m_IO,(vector *)name,local_a0,local_98,
                                  SUB81(local_a8,0));
          }
          else {
            adios2::ToString_abi_cxx11_((DataType)&local_70);
            GetType<long>();
            puVar2 = local_90;
            if (local_70._M_string_length == local_88) {
              if (local_70._M_string_length == 0) {
                bVar6 = true;
              }
              else {
                iVar3 = bcmp(local_70._M_dataplus._M_p,local_90,local_70._M_string_length);
                bVar6 = iVar3 == 0;
              }
            }
            else {
              bVar6 = false;
            }
            if (puVar2 != local_80) {
              operator_delete(puVar2);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != paVar1) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            if (bVar6) {
              variable = adios2::core::IO::DefineVariable<long>
                                   ((string *)this->m_IO,(vector *)name,local_a0,local_98,
                                    SUB81(local_a8,0));
            }
            else {
              adios2::ToString_abi_cxx11_((DataType)&local_70);
              GetType<unsigned_char>();
              puVar2 = local_90;
              if (local_70._M_string_length == local_88) {
                if (local_70._M_string_length == 0) {
                  bVar6 = true;
                }
                else {
                  iVar3 = bcmp(local_70._M_dataplus._M_p,local_90,local_70._M_string_length);
                  bVar6 = iVar3 == 0;
                }
              }
              else {
                bVar6 = false;
              }
              if (puVar2 != local_80) {
                operator_delete(puVar2);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != paVar1) {
                operator_delete(local_70._M_dataplus._M_p);
              }
              if (bVar6) {
                variable = adios2::core::IO::DefineVariable<unsigned_char>
                                     ((string *)this->m_IO,(vector *)name,local_a0,local_98,
                                      SUB81(local_a8,0));
              }
              else {
                adios2::ToString_abi_cxx11_((DataType)&local_70);
                GetType<unsigned_short>();
                puVar2 = local_90;
                if (local_70._M_string_length == local_88) {
                  if (local_70._M_string_length == 0) {
                    bVar6 = true;
                  }
                  else {
                    iVar3 = bcmp(local_70._M_dataplus._M_p,local_90,local_70._M_string_length);
                    bVar6 = iVar3 == 0;
                  }
                }
                else {
                  bVar6 = false;
                }
                if (puVar2 != local_80) {
                  operator_delete(puVar2);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70._M_dataplus._M_p != paVar1) {
                  operator_delete(local_70._M_dataplus._M_p);
                }
                if (bVar6) {
                  variable = adios2::core::IO::DefineVariable<unsigned_short>
                                       ((string *)this->m_IO,(vector *)name,local_a0,local_98,
                                        SUB81(local_a8,0));
                }
                else {
                  adios2::ToString_abi_cxx11_((DataType)&local_70);
                  GetType<unsigned_int>();
                  puVar2 = local_90;
                  if (local_70._M_string_length == local_88) {
                    if (local_70._M_string_length == 0) {
                      bVar6 = true;
                    }
                    else {
                      iVar3 = bcmp(local_70._M_dataplus._M_p,local_90,local_70._M_string_length);
                      bVar6 = iVar3 == 0;
                    }
                  }
                  else {
                    bVar6 = false;
                  }
                  if (puVar2 != local_80) {
                    operator_delete(puVar2);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_70._M_dataplus._M_p != paVar1) {
                    operator_delete(local_70._M_dataplus._M_p);
                  }
                  if (bVar6) {
                    variable = adios2::core::IO::DefineVariable<unsigned_int>
                                         ((string *)this->m_IO,(vector *)name,local_a0,local_98,
                                          SUB81(local_a8,0));
                  }
                  else {
                    adios2::ToString_abi_cxx11_((DataType)&local_70);
                    GetType<unsigned_long>();
                    puVar2 = local_90;
                    if (local_70._M_string_length == local_88) {
                      if (local_70._M_string_length == 0) {
                        bVar6 = true;
                      }
                      else {
                        iVar3 = bcmp(local_70._M_dataplus._M_p,local_90,local_70._M_string_length);
                        bVar6 = iVar3 == 0;
                      }
                    }
                    else {
                      bVar6 = false;
                    }
                    if (puVar2 != local_80) {
                      operator_delete(puVar2);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_70._M_dataplus._M_p != paVar1) {
                      operator_delete(local_70._M_dataplus._M_p);
                    }
                    if (bVar6) {
                      variable = adios2::core::IO::DefineVariable<unsigned_long>
                                           ((string *)this->m_IO,(vector *)name,local_a0,local_98,
                                            SUB81(local_a8,0));
                    }
                    else {
                      adios2::ToString_abi_cxx11_((DataType)&local_70);
                      GetType<float>();
                      puVar2 = local_90;
                      if (local_70._M_string_length == local_88) {
                        if (local_70._M_string_length == 0) {
                          bVar6 = true;
                        }
                        else {
                          iVar3 = bcmp(local_70._M_dataplus._M_p,local_90,local_70._M_string_length)
                          ;
                          bVar6 = iVar3 == 0;
                        }
                      }
                      else {
                        bVar6 = false;
                      }
                      if (puVar2 != local_80) {
                        operator_delete(puVar2);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_70._M_dataplus._M_p != paVar1) {
                        operator_delete(local_70._M_dataplus._M_p);
                      }
                      if (bVar6) {
                        variable = adios2::core::IO::DefineVariable<float>
                                             ((string *)this->m_IO,(vector *)name,local_a0,local_98,
                                              SUB81(local_a8,0));
                      }
                      else {
                        adios2::ToString_abi_cxx11_((DataType)&local_70);
                        GetType<double>();
                        puVar2 = local_90;
                        if (local_70._M_string_length == local_88) {
                          if (local_70._M_string_length == 0) {
                            bVar6 = true;
                          }
                          else {
                            iVar3 = bcmp(local_70._M_dataplus._M_p,local_90,
                                         local_70._M_string_length);
                            bVar6 = iVar3 == 0;
                          }
                        }
                        else {
                          bVar6 = false;
                        }
                        if (puVar2 != local_80) {
                          operator_delete(puVar2);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_70._M_dataplus._M_p != paVar1) {
                          operator_delete(local_70._M_dataplus._M_p);
                        }
                        if (bVar6) {
                          variable = adios2::core::IO::DefineVariable<double>
                                               ((string *)this->m_IO,(vector *)name,local_a0,
                                                local_98,SUB81(local_a8,0));
                        }
                        else {
                          adios2::ToString_abi_cxx11_((DataType)&local_70);
                          GetType<long_double>();
                          puVar2 = local_90;
                          if (local_70._M_string_length == local_88) {
                            if (local_70._M_string_length == 0) {
                              bVar6 = true;
                            }
                            else {
                              iVar3 = bcmp(local_70._M_dataplus._M_p,local_90,
                                           local_70._M_string_length);
                              bVar6 = iVar3 == 0;
                            }
                          }
                          else {
                            bVar6 = false;
                          }
                          if (puVar2 != local_80) {
                            operator_delete(puVar2);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_70._M_dataplus._M_p != paVar1) {
                            operator_delete(local_70._M_dataplus._M_p);
                          }
                          if (bVar6) {
                            variable = adios2::core::IO::DefineVariable<long_double>
                                                 ((string *)this->m_IO,(vector *)name,local_a0,
                                                  local_98,SUB81(local_a8,0));
                          }
                          else {
                            adios2::ToString_abi_cxx11_((DataType)&local_70);
                            GetType<std::complex<float>>();
                            puVar2 = local_90;
                            if (local_70._M_string_length == local_88) {
                              if (local_70._M_string_length == 0) {
                                bVar6 = true;
                              }
                              else {
                                iVar3 = bcmp(local_70._M_dataplus._M_p,local_90,
                                             local_70._M_string_length);
                                bVar6 = iVar3 == 0;
                              }
                            }
                            else {
                              bVar6 = false;
                            }
                            if (puVar2 != local_80) {
                              operator_delete(puVar2);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_70._M_dataplus._M_p != paVar1) {
                              operator_delete(local_70._M_dataplus._M_p);
                            }
                            if (bVar6) {
                              variable = adios2::core::IO::DefineVariable<std::complex<float>>
                                                   ((string *)this->m_IO,(vector *)name,local_a0,
                                                    local_98,SUB81(local_a8,0));
                            }
                            else {
                              adios2::ToString_abi_cxx11_((DataType)&local_70);
                              GetType<std::complex<double>>();
                              if (local_70._M_string_length == local_88) {
                                if (local_70._M_string_length == 0) {
                                  bVar6 = true;
                                }
                                else {
                                  iVar3 = bcmp(local_70._M_dataplus._M_p,local_90,
                                               local_70._M_string_length);
                                  bVar6 = iVar3 == 0;
                                }
                              }
                              else {
                                bVar6 = false;
                              }
                              if (local_90 != local_80) {
                                operator_delete(local_90);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_70._M_dataplus._M_p != paVar1) {
                                operator_delete(local_70._M_dataplus._M_p);
                              }
                              if (bVar6) {
                                variable = adios2::core::IO::DefineVariable<std::complex<double>>
                                                     ((string *)this->m_IO,(vector *)name,local_a0,
                                                      local_98,SUB81(local_a8,0));
                              }
                              else {
                                variable = (Variable *)0x0;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  VariableNT::VariableNT(&local_b0,(VariableBase *)variable);
  return (VariableNT)local_b0.m_Variable;
}

Assistant:

VariableNT IO::DefineVariable(const DataType type, const std::string &name, const Dims &shape,
                              const Dims &start, const Dims &count, const bool constantDims)
{
    helper::CheckForNullptr(m_IO, "for variable name " + name + ", in call to IO::DefineVariable");
#define declare_type(T)                                                                            \
    if (ToString(type) == GetType<T>())                                                            \
    {                                                                                              \
        return VariableNT(&m_IO->DefineVariable<typename TypeInfo<T>::IOType>(                     \
            name, shape, start, count, constantDims));                                             \
    }
    ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    else
    {
        return nullptr;
    }
}